

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  Expr *p;
  int iVar1;
  ExprList *pEVar2;
  Expr *extraout_RDX;
  Expr *extraout_RDX_00;
  Expr *extraout_RDX_01;
  Expr *extraout_RDX_02;
  ExprList_item *pEVar3;
  int iVar4;
  ExprList_item *pEVar5;
  long lVar6;
  long lVar7;
  int iCol;
  int local_94;
  char *local_90;
  ExprList *local_88;
  int local_7c;
  Parse *local_78;
  NameContext *local_70;
  Walker local_68;
  
  local_78 = pNC->pParse;
  local_90 = zType;
  local_88 = pOrderBy;
  local_70 = pNC;
  if (0 < pOrderBy->nExpr) {
    local_7c = pSelect->pEList->nExpr;
    pEVar3 = pOrderBy->a;
    iVar4 = 0;
    do {
      pExpr = pEVar3->pExpr;
      p = pExpr;
      while (p != (Expr *)0x0) {
        if ((p->flags & 0x82000) == 0) {
          if ((*local_90 == 'G') ||
             (local_94 = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,(Expr *)pOrderBy),
             pOrderBy = (ExprList *)extraout_RDX, local_94 < 1)) {
            iVar1 = sqlite3ExprIsInteger(p,&local_94);
            if (iVar1 == 0) {
              (pEVar3->u).x.iOrderByCol = 0;
              iVar1 = sqlite3ResolveExprNames(local_70,pExpr);
              if (iVar1 != 0) {
                return 1;
              }
              pEVar2 = pSelect->pEList;
              pOrderBy = (ExprList *)extraout_RDX_00;
              if (0 < pEVar2->nExpr) {
                lVar6 = 8;
                lVar7 = 0;
                do {
                  iVar1 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                             *(Expr **)((long)pEVar2->a + lVar6 + -8),-1);
                  pOrderBy = (ExprList *)extraout_RDX_01;
                  if (iVar1 == 0) {
                    if (pSelect->pWin != (Window *)0x0) {
                      local_68.pParse = (Parse *)0x0;
                      local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
                      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
                      local_68.walkerDepth = 0;
                      local_68.eCode = 0;
                      local_68._38_2_ = 0;
                      local_68.xExprCallback = resolveRemoveWindowsCb;
                      local_68.u.pSelect = pSelect;
                      walkExpr(&local_68,pExpr);
                      pOrderBy = (ExprList *)extraout_RDX_02;
                    }
                    (pEVar3->u).x.iOrderByCol = (short)lVar7 + 1;
                  }
                  lVar7 = lVar7 + 1;
                  pEVar2 = pSelect->pEList;
                  lVar6 = lVar6 + 0x18;
                } while (lVar7 < pEVar2->nExpr);
              }
              break;
            }
            pOrderBy = (ExprList *)0xffff0000;
            if (local_94 - 0x10000U < 0xffff0001) {
              resolveOutOfRangeError(local_78,local_90,iVar4 + 1,local_7c,p);
              return 1;
            }
          }
          (pEVar3->u).x.iOrderByCol = (u16)local_94;
          break;
        }
        if ((p->flags >> 0x13 & 1) == 0) {
          pEVar5 = (ExprList_item *)&p->pLeft;
        }
        else {
          pEVar5 = ((p->x).pList)->a;
        }
        p = pEVar5->pExpr;
      }
      iVar4 = iVar4 + 1;
      pEVar3 = pEVar3 + 1;
    } while (iVar4 < local_88->nExpr);
  }
  iVar4 = sqlite3ResolveOrderGroupBy(local_78,pSelect,local_88,local_90);
  return iVar4;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  assert( pOrderBy!=0 );
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pE);
    if( NEVER(pE2==0) ) continue;
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult, pE2);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        /* Since this expresion is being changed into a reference
        ** to an identical expression in the result set, remove all Window
        ** objects belonging to the expression from the Select.pWin list. */
        windowRemoveExprFromSelect(pSelect, pE);
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}